

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O2

void __thiscall leveldb::Benchmark::Open(Benchmark *this)

{
  FILE *__stream;
  allocator local_a9;
  Status s;
  string local_a0;
  Options options;
  
  if (this->db_ != (DB *)0x0) {
    __assert_fail("db_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/benchmarks/db_bench.cc"
                  ,0x2b1,"void leveldb::Benchmark::Open()");
  }
  Options::Options(&options);
  options.env = (anonymous_namespace)::g_env;
  options.create_if_missing = (bool)(FLAGS_use_existing_db ^ 1);
  options.block_cache = this->cache_;
  options.write_buffer_size = (size_t)FLAGS_write_buffer_size;
  options.max_file_size = (size_t)FLAGS_max_file_size;
  options.block_size = (size_t)FLAGS_block_size;
  options.max_open_files = FLAGS_open_files;
  options.filter_policy = this->filter_policy_;
  options.reuse_logs = FLAGS_reuse_logs;
  std::__cxx11::string::string((string *)&local_a0,FLAGS_db,&local_a9);
  DB::Open((DB *)&s,&options,&local_a0,&this->db_);
  std::__cxx11::string::_M_dispose();
  __stream = _stderr;
  if (s.state_ == (char *)0x0) {
    Status::~Status(&s);
    return;
  }
  Status::ToString_abi_cxx11_(&local_a0,&s);
  fprintf(__stream,"open error: %s\n",local_a0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_a0);
  exit(1);
}

Assistant:

void Open() {
    assert(db_ == nullptr);
    Options options;
    options.env = g_env;
    options.create_if_missing = !FLAGS_use_existing_db;
    options.block_cache = cache_;
    options.write_buffer_size = FLAGS_write_buffer_size;
    options.max_file_size = FLAGS_max_file_size;
    options.block_size = FLAGS_block_size;
    options.max_open_files = FLAGS_open_files;
    options.filter_policy = filter_policy_;
    options.reuse_logs = FLAGS_reuse_logs;
    Status s = DB::Open(options, FLAGS_db, &db_);
    if (!s.ok()) {
      std::fprintf(stderr, "open error: %s\n", s.ToString().c_str());
      std::exit(1);
    }
  }